

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNCnst.cpp
# Opt level: O0

void __thiscall NaPNConstGen::NaPNConstGen(NaPNConstGen *this,char *szNodeName)

{
  NaPetriCnOutput *in_RSI;
  long *in_RDI;
  char *in_stack_000003f8;
  NaPetriNode *in_stack_00000400;
  char *in_stack_ffffffffffffffe0;
  NaPetriNode *in_stack_ffffffffffffffe8;
  
  NaPetriNode::NaPetriNode(in_stack_00000400,in_stack_000003f8);
  *in_RDI = (long)&PTR__NaPNConstGen_00195228;
  NaPetriCnOutput::NaPetriCnOutput(in_RSI,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  *(undefined4 *)(in_RDI + 0x19) = 0;
  in_RDI[0x1a] = 0;
  (**(code **)(*in_RDI + 0xa8))(in_RDI,1);
  (**(code **)(*in_RDI + 0xb0))(0);
  return;
}

Assistant:

NaPNConstGen::NaPNConstGen (const char* szNodeName)
: NaPetriNode(szNodeName),
  nOutDim(0),
  fConstVal(NULL),
  ////////////////
  // Connectors //
  ////////////////
  out(this, "out")
{
    set_out_dim(1);
    set_const_value(0.0);
}